

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gc.cpp
# Opt level: O0

void __thiscall Gc_Nothing_Test::TestBody(Gc_Nothing_Test *this)

{
  MockSpec<int_(std::initializer_list<const_char_*>)> *this_00;
  TypedExpectation<int_(std::initializer_list<const_char_*>)> *this_01;
  MockSpec<void_(const_int_&)> *this_02;
  TypedExpectation<void_(const_int_&)> *this_03;
  type local_1f0;
  thread local_1e8;
  thread thread;
  Matcher<const_int_&> local_1d8;
  MockSpec<void_(const_int_&)> local_1c0;
  WithoutMatchers local_19d [13];
  Matcher<std::initializer_list<const_char_*>_> local_190;
  MockSpec<int_(std::initializer_list<const_char_*>)> local_178;
  undefined1 local_158 [8];
  test_watch_thread gc;
  Gc_Nothing_Test *this_local;
  
  gc.gmock01_kill_50.super_UntypedFunctionMockerBase.untyped_expectations_.
  super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  anon_unknown.dwarf_44f6e::test_watch_thread::test_watch_thread((test_watch_thread *)local_158);
  testing::Matcher<std::initializer_list<char_const*>>::
  Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<std::initializer_list<char_const*>> *)&local_190,
             (AnythingMatcher *)&testing::_);
  anon_unknown.dwarf_44f6e::test_watch_thread::gmock_spawn
            (&local_178,(test_watch_thread *)local_158,&local_190);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<int_(std::initializer_list<const_char_*>)>::operator()
                      (&local_178,local_19d,(void *)0x0);
  this_01 = testing::internal::MockSpec<int_(std::initializer_list<const_char_*>)>::
            InternalExpectedAt(this_00,
                               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_gc.cpp"
                               ,0x98,"gc","spawn (_)");
  testing::internal::TypedExpectation<int_(std::initializer_list<const_char_*>)>::Times(this_01,0);
  testing::internal::MockSpec<int_(std::initializer_list<const_char_*>)>::~MockSpec(&local_178);
  testing::Matcher<std::initializer_list<const_char_*>_>::~Matcher(&local_190);
  testing::Matcher<int_const&>::Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<int_const&> *)&local_1d8,(AnythingMatcher *)&testing::_);
  anon_unknown.dwarf_44f6e::test_watch_thread::gmock_kill
            (&local_1c0,(test_watch_thread *)local_158,&local_1d8);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::MockSpec<void_(const_int_&)>::operator()
                      (&local_1c0,(WithoutMatchers *)((long)&thread._M_id._M_thread + 7),(void *)0x0
                      );
  this_03 = testing::internal::MockSpec<void_(const_int_&)>::InternalExpectedAt
                      (this_02,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_gc.cpp"
                       ,0x99,"gc","kill (_)");
  testing::internal::TypedExpectation<void_(const_int_&)>::Times(this_03,0);
  testing::internal::MockSpec<void_(const_int_&)>::~MockSpec(&local_1c0);
  testing::Matcher<const_int_&>::~Matcher(&local_1d8);
  local_1f0.gc = (test_watch_thread *)local_158;
  std::thread::thread<Gc_Nothing_Test::TestBody()::__0,,void>(&local_1e8,&local_1f0);
  pstore::broker::gc_watch_thread::stop((gc_watch_thread *)local_158,-1);
  std::thread::join();
  std::thread::~thread(&local_1e8);
  anon_unknown.dwarf_44f6e::test_watch_thread::~test_watch_thread((test_watch_thread *)local_158);
  return;
}

Assistant:

TEST_F (Gc, Nothing) {
    test_watch_thread gc;
    EXPECT_CALL (gc, spawn (_)).Times (0);
    EXPECT_CALL (gc, kill (_)).Times (0);

    std::thread thread{[&gc] () { gc.watcher (); }};
    gc.stop ();
    thread.join ();
}